

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

void __thiscall
gepard::SegmentApproximator::splitCubeCurve(SegmentApproximator *this,FloatPoint *points)

{
  Float FVar1;
  FloatPoint FVar2;
  Float local_148;
  FloatPoint local_140;
  Float local_130;
  FloatPoint mid;
  FloatPoint local_118;
  undefined1 local_108 [8];
  FloatPoint bccd;
  FloatPoint local_f0;
  undefined1 local_e0 [8];
  FloatPoint abbc;
  FloatPoint local_c8;
  undefined1 local_b8 [8];
  FloatPoint cd;
  FloatPoint local_a0;
  undefined1 local_90 [8];
  FloatPoint bc;
  FloatPoint local_78;
  undefined1 local_68 [8];
  FloatPoint ab;
  FloatPoint d;
  FloatPoint c;
  FloatPoint b;
  FloatPoint a;
  FloatPoint *points_local;
  SegmentApproximator *this_local;
  
  b.y = points->x;
  FVar1 = points->y;
  c.y = points[1].x;
  b.x = points[1].y;
  d.y = points[2].x;
  c.x = points[2].y;
  ab.y = points[3].x;
  d.x = points[3].y;
  local_78 = operator+((FloatPoint *)&b.y,(FloatPoint *)&c.y);
  bc.y = 2.0;
  _local_68 = operator/(&local_78,&bc.y);
  local_a0 = operator+((FloatPoint *)&c.y,(FloatPoint *)&d.y);
  cd.y = 2.0;
  _local_90 = operator/(&local_a0,&cd.y);
  local_c8 = operator+((FloatPoint *)&d.y,(FloatPoint *)&ab.y);
  abbc.y = 2.0;
  _local_b8 = operator/(&local_c8,&abbc.y);
  local_f0 = operator+((FloatPoint *)local_68,(FloatPoint *)local_90);
  bccd.y = 2.0;
  _local_e0 = operator/(&local_f0,&bccd.y);
  local_118 = operator+((FloatPoint *)local_90,(FloatPoint *)local_b8);
  mid.y = 2.0;
  _local_108 = operator/(&local_118,&mid.y);
  local_140 = operator+((FloatPoint *)local_e0,(FloatPoint *)local_108);
  local_148 = 2.0;
  FVar2 = operator/(&local_140,&local_148);
  points->x = b.y;
  points->y = FVar1;
  points[1].x = (Float)local_68;
  points[1].y = ab.x;
  points[2].x = (Float)local_e0;
  points[2].y = abbc.x;
  local_130 = FVar2.x;
  points[3].x = local_130;
  mid.x = FVar2.y;
  points[3].y = mid.x;
  points[4].x = (Float)local_108;
  points[4].y = bccd.x;
  points[5].x = (Float)local_b8;
  points[5].y = cd.x;
  points[6].x = ab.y;
  points[6].y = d.x;
  return;
}

Assistant:

void SegmentApproximator::splitCubeCurve(FloatPoint points[])
{
    const FloatPoint a = points[0];
    const FloatPoint b = points[1];
    const FloatPoint c = points[2];
    const FloatPoint d = points[3];
    const FloatPoint ab = (a + b) / 2.0;
    const FloatPoint bc = (b + c) / 2.0;
    const FloatPoint cd = (c + d) / 2.0;
    const FloatPoint abbc = (ab + bc) / 2.0;
    const FloatPoint bccd = (bc + cd) / 2.0;
    const FloatPoint mid = (abbc + bccd) / 2.0;

    points[0] = a;
    points[1] = ab;
    points[2] = abbc;
    points[3] = mid;
    points[4] = bccd;
    points[5] = cd;
    points[6] = d;
}